

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImFontAtlas::GetTexDataAsAlpha8
          (ImFontAtlas *this,uchar **out_pixels,int *out_width,int *out_height,
          int *out_bytes_per_pixel)

{
  bool bVar1;
  int *in_RCX;
  int *in_RDX;
  undefined8 *in_RSI;
  ImFontAtlas *in_RDI;
  undefined4 *in_R8;
  ImFontConfig *in_stack_00000078;
  ImFontAtlas *in_stack_00000080;
  
  if (in_RDI->TexPixelsAlpha8 == (uchar *)0x0) {
    bVar1 = ImVector<ImFontConfig>::empty(&in_RDI->ConfigData);
    if (bVar1) {
      AddFontDefault(in_stack_00000080,in_stack_00000078);
    }
    Build(in_RDI);
  }
  *in_RSI = in_RDI->TexPixelsAlpha8;
  if (in_RDX != (int *)0x0) {
    *in_RDX = in_RDI->TexWidth;
  }
  if (in_RCX != (int *)0x0) {
    *in_RCX = in_RDI->TexHeight;
  }
  if (in_R8 != (undefined4 *)0x0) {
    *in_R8 = 1;
  }
  return;
}

Assistant:

void    ImFontAtlas::GetTexDataAsAlpha8(unsigned char** out_pixels, int* out_width, int* out_height, int* out_bytes_per_pixel)
{
    // Build atlas on demand
    if (TexPixelsAlpha8 == NULL)
    {
        if (ConfigData.empty())
            AddFontDefault();
        Build();
    }

    *out_pixels = TexPixelsAlpha8;
    if (out_width) *out_width = TexWidth;
    if (out_height) *out_height = TexHeight;
    if (out_bytes_per_pixel) *out_bytes_per_pixel = 1;
}